

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

hash_entry_t * insert(hash_table_t *table,hash_key_t key,hash_data_t data,hash_hashvalue_t value)

{
  hash_entry_t *phVar1;
  hash_entry_t *phVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(long)value % table->table_size;
  uVar4 = uVar3;
  do {
    phVar1 = table->table + uVar4;
    if (table->table[uVar4].status < 2) {
      phVar1->key = key;
      phVar1->data = data;
      phVar1->hash_value = value;
      phVar1->status = 2;
      break;
    }
    uVar4 = uVar4 + 1;
    if (uVar4 == table->table_size) {
      uVar4 = 0;
    }
  } while (uVar4 != uVar3);
  phVar2 = table->head;
  phVar1->next = phVar2;
  phVar1->prev = (hash_entry_t *)0x0;
  if (phVar2 != (hash_entry_t *)0x0) {
    phVar2->prev = phVar1;
  }
  table->head = phVar1;
  table->entry_count = table->entry_count + 1;
  return phVar1;
}

Assistant:

static hash_entry_t *insert(hash_table_t *table, hash_key_t key, hash_data_t data, hash_hashvalue_t value)
{
   unsigned long index = (unsigned long)value % table->table_size;
   unsigned long startindex = index;

   hash_entry_t *entry = NULL;
   do {
      entry = table->table + index;
      if (entry->status == EMPTY || entry->status == TOMBSTONE) {
         entry->key = key;
         entry->data = data;
         entry->hash_value = value;
         entry->status = INUSE;
         break;
      }
      index++;
      if (index == table->table_size)
         index = 0;
   } while (index != startindex);

   if (!entry)
      return NULL;

   entry->next = table->head;
   entry->prev = NULL;
   if (table->head)
      table->head->prev = entry;
   table->head = entry;
   table->entry_count++;         

   return entry;
}